

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.c
# Opt level: O0

char * yrmcds_strerror(yrmcds_error e)

{
  char *pcStack_10;
  yrmcds_error e_local;
  
  switch(e) {
  case YRMCDS_OK:
    pcStack_10 = "OK";
    break;
  case YRMCDS_SYSTEM_ERROR:
    pcStack_10 = "Check errno for details";
    break;
  case YRMCDS_BAD_ARGUMENT:
    pcStack_10 = "Bad argument";
    break;
  case YRMCDS_NOT_RESOLVED:
    pcStack_10 = "Host not found";
    break;
  case YRMCDS_TIMEOUT:
    pcStack_10 = "Timeout";
    break;
  case YRMCDS_DISCONNECTED:
    pcStack_10 = "Connection was reset by peer";
    break;
  case YRMCDS_OUT_OF_MEMORY:
    pcStack_10 = "Failed to allocate memory";
    break;
  case YRMCDS_COMPRESS_FAILED:
    pcStack_10 = "Failed to compress data";
    break;
  case YRMCDS_PROTOCOL_ERROR:
    pcStack_10 = "Received malformed packet";
    break;
  case YRMCDS_NOT_IMPLEMENTED:
    pcStack_10 = "Not implemented";
    break;
  case YRMCDS_IN_BINARY:
    pcStack_10 = "Connection is fixed for binary protocol";
    break;
  case YRMCDS_BAD_KEY:
    pcStack_10 = "Bad key";
    break;
  default:
    pcStack_10 = "Unknown error";
  }
  return pcStack_10;
}

Assistant:

const char* yrmcds_strerror(yrmcds_error e) {
    switch( e ) {
    case YRMCDS_OK:
        return "OK";
    case YRMCDS_SYSTEM_ERROR:
        return "Check errno for details";
    case YRMCDS_BAD_ARGUMENT:
        return "Bad argument";
    case YRMCDS_NOT_RESOLVED:
        return "Host not found";
    case YRMCDS_TIMEOUT:
        return "Timeout";
    case YRMCDS_DISCONNECTED:
        return "Connection was reset by peer";
    case YRMCDS_OUT_OF_MEMORY:
        return "Failed to allocate memory";
    case YRMCDS_COMPRESS_FAILED:
        return "Failed to compress data";
    case YRMCDS_PROTOCOL_ERROR:
        return "Received malformed packet";
    case YRMCDS_NOT_IMPLEMENTED:
        return "Not implemented";
    case YRMCDS_IN_BINARY:
        return "Connection is fixed for binary protocol";
    case YRMCDS_BAD_KEY:
        return "Bad key";
    default:
        return "Unknown error";
    };
}